

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL12_compat.c
# Opt level: O0

void UpdateRelativeMouseMode(void)

{
  SDL_bool SVar1;
  SDL_bool enable;
  
  if ((VideoWindow20 != (SDL_Window *)0x0) &&
     (SVar1 = (SDL_bool)(VideoWindowGrabbed != SDL_FALSE && VideoCursorHidden != SDL_FALSE),
     MouseInputIsRelative != SVar1)) {
    MouseInputIsRelative = SVar1;
    (*SDL20_SetRelativeMouseMode)(SVar1);
  }
  return;
}

Assistant:

static void
UpdateRelativeMouseMode(void)
{
    /* in SDL 1.2, hiding+grabbing the cursor was like SDL2's relative mouse mode. */
    if (VideoWindow20) {
        const SDL_bool enable = (VideoWindowGrabbed && VideoCursorHidden) ? SDL_TRUE : SDL_FALSE;
        if (MouseInputIsRelative != enable) {
            MouseInputIsRelative = enable;
            SDL20_SetRelativeMouseMode(MouseInputIsRelative);
        }
    }
}